

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_filter.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConstantFilter::ToExpression(ConstantFilter *this,Expression *column)

{
  long *in_RDX;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_30;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_28;
  _func_int **local_20;
  
  make_uniq<duckdb::BoundConstantExpression,duckdb::Value_const&>
            ((duckdb *)&local_28,(Value *)&(column->super_BaseExpression).alias);
  (**(code **)(*in_RDX + 0x88))(&local_30);
  make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
            ((duckdb *)&local_20,&(column->super_BaseExpression).expression_class,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_30,
             (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
              *)&local_28);
  if (local_30._M_head_impl != (Expression *)0x0) {
    (*((local_30._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  (this->super_TableFilter)._vptr_TableFilter = local_20;
  if (local_28._M_head_impl != (BoundConstantExpression *)0x0) {
    (*((local_28._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ConstantFilter::ToExpression(const Expression &column) const {
	auto bound_constant = make_uniq<BoundConstantExpression>(constant);
	auto result = make_uniq<BoundComparisonExpression>(comparison_type, column.Copy(), std::move(bound_constant));
	return std::move(result);
}